

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::setVolumeMass(btSoftBody *this,btScalar mass)

{
  uint uVar1;
  Node *pNVar2;
  Tetra *pTVar3;
  Node *pNVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float *__s;
  btScalar *pbVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  Node **ppNVar11;
  long lVar12;
  int j;
  long lVar13;
  int iVar14;
  size_t size;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  btAlignedObjectArray<float> ranks;
  btAlignedObjectArray<float> local_40;
  
  local_40.m_ownsMemory = true;
  local_40.m_data = (float *)0x0;
  local_40.m_size = 0;
  local_40.m_capacity = 0;
  uVar1 = (this->m_nodes).m_size;
  if ((long)(int)uVar1 < 1) {
    local_40.m_capacity = 0;
    local_40.m_size = uVar1;
    bVar5 = false;
    __s = (float *)0x0;
    uVar9 = uVar1;
    goto LAB_001d66bf;
  }
  size = (long)(int)uVar1 << 2;
  __s = (float *)btAlignedAllocInternal(size,0x10);
  if ((long)local_40.m_size < 1) {
    if (local_40.m_data != (float *)0x0) goto LAB_001d655a;
  }
  else {
    lVar8 = 0;
    do {
      __s[lVar8] = local_40.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (local_40.m_size != lVar8);
LAB_001d655a:
    if (local_40.m_ownsMemory == true) {
      btAlignedFreeInternal(local_40.m_data);
    }
  }
  local_40.m_ownsMemory = true;
  local_40.m_data = __s;
  local_40.m_capacity = uVar1;
  memset(__s,0,size);
  auVar6 = _DAT_001ee270;
  uVar9 = (this->m_nodes).m_size;
  lVar8 = (long)(int)uVar9;
  local_40.m_size = uVar1;
  bVar5 = 0 < lVar8;
  if (lVar8 < 1) {
    bVar5 = false;
  }
  else {
    pNVar2 = (this->m_nodes).m_data;
    lVar8 = lVar8 + -1;
    auVar15._8_4_ = (int)lVar8;
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar15 = auVar15 ^ _DAT_001ee270;
    auVar16 = _DAT_001ee5c0;
    auVar17 = _DAT_001ee5d0;
    do {
      auVar18 = auVar17 ^ auVar6;
      iVar14 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar14 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar14 < auVar18._4_4_) & 1)) {
        *(undefined4 *)((long)(&pNVar2->m_n + 1) + lVar8) = 0;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        *(undefined4 *)((long)(&pNVar2[1].m_n + 1) + lVar8) = 0;
      }
      auVar18 = auVar16 ^ auVar6;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar14 && (iVar19 != iVar14 || auVar18._0_4_ <= auVar15._0_4_)) {
        *(undefined4 *)((long)(&pNVar2[2].m_n + 1) + lVar8) = 0;
        *(undefined4 *)((long)(&pNVar2[3].m_n + 1) + lVar8) = 0;
      }
      lVar12 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar12 + 4;
      lVar12 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar12 + 4;
      lVar8 = lVar8 + 0x1e0;
    } while ((ulong)(uVar9 + 3 >> 2) * 0x1e0 - lVar8 != 0);
  }
LAB_001d66bf:
  lVar8 = (long)(this->m_tetras).m_size;
  if (0 < lVar8) {
    pNVar2 = (this->m_nodes).m_data;
    pTVar3 = (this->m_tetras).m_data;
    ppNVar11 = pTVar3->m_n;
    lVar12 = 0;
    do {
      lVar13 = 0;
      do {
        pNVar4 = ppNVar11[lVar13];
        pNVar4->m_im = ABS(pTVar3[lVar12].m_rv) + pNVar4->m_im;
        iVar14 = (int)((ulong)((long)pNVar4 - (long)pNVar2) >> 3) * -0x11111111;
        __s[iVar14] = __s[iVar14] + 1.0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      lVar12 = lVar12 + 1;
      ppNVar11 = ppNVar11 + 0x11;
    } while (lVar12 != lVar8);
  }
  if (bVar5) {
    pbVar7 = &((this->m_nodes).m_data)->m_im;
    uVar10 = 0;
    do {
      if (0.0 < *pbVar7) {
        *pbVar7 = local_40.m_data[uVar10] / *pbVar7;
      }
      uVar10 = uVar10 + 1;
      pbVar7 = pbVar7 + 0x1e;
    } while (uVar9 != uVar10);
  }
  setTotalMass(this,mass,false);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_40);
  return;
}

Assistant:

void			btSoftBody::setVolumeMass(btScalar mass)
{
btAlignedObjectArray<btScalar>	ranks;
ranks.resize(m_nodes.size(),0);
int i;

for(i=0;i<m_nodes.size();++i)
	{
	m_nodes[i].m_im=0;
	}
for(i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		t.m_n[j]->m_im+=btFabs(t.m_rv);
		ranks[int(t.m_n[j]-&m_nodes[0])]+=1;
		}
	}
for( i=0;i<m_nodes.size();++i)
	{
	if(m_nodes[i].m_im>0)
		{
		m_nodes[i].m_im=ranks[i]/m_nodes[i].m_im;
		}
	}
setTotalMass(mass,false);
}